

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_CreateDevice_Ex
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
          IOTHUB_REGISTRY_DEVICE_CREATE_EX *deviceCreateInfo,IOTHUB_DEVICE_EX *deviceInfo)

{
  undefined4 uVar1;
  undefined1 uVar2;
  IOTHUB_REGISTRYMANAGER_RESULT IVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  char *pcVar6;
  IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE local_f8;
  IOTHUB_DEVICE_OR_MODULE local_c0;
  
  if ((deviceCreateInfo == (IOTHUB_REGISTRY_DEVICE_CREATE_EX *)0x0 ||
      registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0) ||
      deviceInfo == (IOTHUB_DEVICE_EX *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar6 = "Input parameter cannot be NULL";
    IVar3 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar5 = 0x5e7;
  }
  else if (deviceCreateInfo->version == 1) {
    if (deviceInfo->version == 1) {
      memset(&local_c0,0,0xa0);
      local_f8.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;
      local_f8._4_4_ = 0;
      local_f8.moduleId = (char *)0x0;
      local_f8.managedBy = (char *)0x0;
      local_f8.deviceId = deviceCreateInfo->deviceId;
      local_f8.primaryKey = deviceCreateInfo->primaryKey;
      local_f8.secondaryKey = deviceCreateInfo->secondaryKey;
      uVar1 = deviceCreateInfo->authMethod;
      uVar2 = deviceCreateInfo->iotEdge_capable;
      local_f8.iotEdge_capable = (_Bool)uVar2;
      local_f8.authMethod = uVar1;
      local_f8._37_3_ = 0;
      IVar3 = IoTHubRegistryManager_CreateDeviceOrModule(registryManagerHandle,&local_f8,&local_c0);
      if (IVar3 != IOTHUB_REGISTRYMANAGER_OK) {
        return IVar3;
      }
      move_deviceOrModule_members_to_deviceEx(&local_c0,deviceInfo);
      free(local_c0.moduleId);
      local_c0.moduleId = (char *)0x0;
      free(local_c0.managedBy);
      return IOTHUB_REGISTRYMANAGER_OK;
    }
    p_Var4 = xlogging_get_log_function();
    IVar3 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar6 = "deviceInfo must have a valid version";
    iVar5 = 0x5f3;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    IVar3 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar6 = "deviceCreateInfo must have a valid version";
    iVar5 = 0x5ed;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_CreateDevice_Ex",iVar5,1,pcVar6);
  return IVar3;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_CreateDevice_Ex(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const IOTHUB_REGISTRY_DEVICE_CREATE_EX* deviceCreateInfo, IOTHUB_DEVICE_EX* deviceInfo)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceCreateInfo == NULL) || (deviceInfo == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((deviceCreateInfo->version < IOTHUB_REGISTRY_DEVICE_CREATE_EX_VERSION_1) ||
            (deviceCreateInfo->version > IOTHUB_REGISTRY_DEVICE_CREATE_EX_VERSION_LATEST))
    {
        LogError("deviceCreateInfo must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else if ((deviceInfo->version < IOTHUB_DEVICE_EX_VERSION_1) ||
            (deviceInfo->version > IOTHUB_DEVICE_EX_VERSION_LATEST))
    {
        LogError("deviceInfo must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_REGISTRY_DEVICE_OR_MODULE_CREATE deviceOrModuleCreateInfo;
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;

        memset(&deviceOrModuleInfo, 0, sizeof(deviceOrModuleInfo));
        memset(&deviceOrModuleCreateInfo, 0, sizeof(deviceOrModuleCreateInfo));
        deviceOrModuleCreateInfo.type = IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE;

        if (deviceCreateInfo->version >= IOTHUB_REGISTRY_DEVICE_CREATE_EX_VERSION_1)
        {
            deviceOrModuleCreateInfo.deviceId = deviceCreateInfo->deviceId;
            deviceOrModuleCreateInfo.primaryKey = deviceCreateInfo->primaryKey;
            deviceOrModuleCreateInfo.secondaryKey = deviceCreateInfo->secondaryKey;
            deviceOrModuleCreateInfo.authMethod = deviceCreateInfo->authMethod;
            deviceOrModuleCreateInfo.iotEdge_capable = deviceCreateInfo->iotEdge_capable;
        }

        result = IoTHubRegistryManager_CreateDeviceOrModule(registryManagerHandle, &deviceOrModuleCreateInfo, &deviceOrModuleInfo);
        if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_deviceEx(&deviceOrModuleInfo, deviceInfo);
            free_nonDeviceEx_members_from_deviceOrModule(&deviceOrModuleInfo);
        }
    }

    return result;
}